

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_leave(DisasContext *s)

{
  int iVar1;
  MemOp MVar2;
  TCGContext *tcg_ctx;
  TCGv_i64 addr;
  TCGv_i64 val;
  TCGContext *s_00;
  TCGArg a2;
  MemOp memop;
  TCGTemp *ts;
  MemOp aflag;
  
  tcg_ctx = s->uc->tcg_ctx;
  iVar1 = s->code64;
  aflag = MO_64;
  if (iVar1 == 0) {
    aflag = MO_32 - (s->ss32 == 0);
  }
  MVar2 = s->dflag;
  gen_lea_v_seg(s,aflag,tcg_ctx->cpu_regs[5],2,-1);
  addr = s->A0;
  val = s->T0;
  s_00 = s->uc->tcg_ctx;
  if (s->uc->hook[10].head != (list_item *)0x0) {
    a2 = s->prev_pc;
    ts = tcg_temp_new_internal_x86_64(s_00,TCG_TYPE_I64,false);
    tcg_gen_op2_x86_64(s_00,INDEX_op_movi_i64,(TCGArg)ts,a2);
    tcg_gen_op3_x86_64(s_00,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),0x80);
    tcg_temp_free_internal_x86_64(s_00,ts);
  }
  memop = (MVar2 != MO_16) + 1 + (uint)(MVar2 != MO_16);
  if (iVar1 == 0) {
    memop = MVar2;
  }
  tcg_gen_qemu_ld_i64_x86_64(s_00,val,addr,(long)s->mem_index,memop);
  tcg_gen_addi_i64_x86_64(tcg_ctx,s->T1,tcg_ctx->cpu_regs[5],1L << ((byte)memop & 0x3f));
  gen_op_mov_reg_v(s,memop,5,s->T0);
  gen_op_mov_reg_v(s,aflag,4,s->T1);
  return;
}

Assistant:

static void gen_leave(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    MemOp d_ot = mo_pushpop(s, s->dflag);
    MemOp a_ot = mo_stacksize(s);

    gen_lea_v_seg(s, a_ot, tcg_ctx->cpu_regs[R_EBP], R_SS, -1);
    gen_op_ld_v(s, d_ot, s->T0, s->A0);

    tcg_gen_addi_tl(tcg_ctx, s->T1, tcg_ctx->cpu_regs[R_EBP], 1ULL << d_ot);

    gen_op_mov_reg_v(s, d_ot, R_EBP, s->T0);
    gen_op_mov_reg_v(s, a_ot, R_ESP, s->T1);
}